

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

void ma_context_enumerate_devices_sink_callback__pulse
               (ma_pa_context *pPulseContext,ma_pa_sink_info *pSinkInfo,int endOfList,
               void *pUserData)

{
  int iVar1;
  char local_260 [8];
  ma_device_info deviceInfo;
  ma_context_enumerate_devices_callback_data__pulse *pData;
  void *pUserData_local;
  int endOfList_local;
  ma_pa_sink_info *pSinkInfo_local;
  ma_pa_context *pPulseContext_local;
  
  deviceInfo._552_8_ = pUserData;
  if (pUserData == (void *)0x0) {
    __assert_fail("pData != __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/BombchuLink[P]ORGTerm/miniaudio.h"
                  ,0x4a60,
                  "void ma_context_enumerate_devices_sink_callback__pulse(ma_pa_context *, const ma_pa_sink_info *, int, void *)"
                 );
  }
  if ((endOfList == 0) && (*(int *)((long)pUserData + 0x18) == 0)) {
    memset(local_260,0,0x230);
    if (pSinkInfo->name != (char *)0x0) {
      ma_strncpy_s(local_260,0x100,pSinkInfo->name,0xffffffffffffffff);
    }
    if (pSinkInfo->description != (char *)0x0) {
      ma_strncpy_s(deviceInfo.id.alsa + 0xf8,0x100,pSinkInfo->description,0xffffffffffffffff);
    }
    iVar1 = (**(code **)(deviceInfo._552_8_ + 8))
                      (*(undefined8 *)deviceInfo._552_8_,1,local_260,
                       *(undefined8 *)(deviceInfo._552_8_ + 0x10));
    *(uint *)(deviceInfo._552_8_ + 0x18) = (uint)((iVar1 != 0 ^ 0xffU) & 1);
  }
  return;
}

Assistant:

static void ma_context_enumerate_devices_sink_callback__pulse(ma_pa_context* pPulseContext, const ma_pa_sink_info* pSinkInfo, int endOfList, void* pUserData)
{
    ma_context_enumerate_devices_callback_data__pulse* pData = (ma_context_enumerate_devices_callback_data__pulse*)pUserData;
    ma_device_info deviceInfo;

    MA_ASSERT(pData != NULL);

    if (endOfList || pData->isTerminated) {
        return;
    }

    MA_ZERO_OBJECT(&deviceInfo);

    /* The name from PulseAudio is the ID for miniaudio. */
    if (pSinkInfo->name != NULL) {
        ma_strncpy_s(deviceInfo.id.pulse, sizeof(deviceInfo.id.pulse), pSinkInfo->name, (size_t)-1);
    }

    /* The description from PulseAudio is the name for miniaudio. */
    if (pSinkInfo->description != NULL) {
        ma_strncpy_s(deviceInfo.name, sizeof(deviceInfo.name), pSinkInfo->description, (size_t)-1);
    }

    pData->isTerminated = !pData->callback(pData->pContext, ma_device_type_playback, &deviceInfo, pData->pUserData);

    (void)pPulseContext; /* Unused. */
}